

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

void __thiscall wasm::WasmBinaryBuilder::visitGlobalGet(WasmBinaryBuilder *this,GlobalGet *curr)

{
  bool bVar1;
  ostream *this_00;
  void *this_01;
  size_type sVar2;
  reference this_02;
  mapped_type *this_03;
  ulong uVar3;
  Name *local_68;
  pointer local_60;
  Global *global;
  allocator<char> local_41;
  string local_40;
  uint local_1c;
  GlobalGet *pGStack_18;
  uint32_t index;
  GlobalGet *curr_local;
  WasmBinaryBuilder *this_local;
  
  pGStack_18 = curr;
  curr_local = (GlobalGet *)this;
  bVar1 = isDebugEnabled("binary");
  if (bVar1) {
    this_00 = std::operator<<((ostream *)&std::cerr,"zz node: GlobalGet ");
    this_01 = (void *)std::ostream::operator<<(this_00,this->pos);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  }
  local_1c = getU32LEB(this);
  uVar3 = (ulong)local_1c;
  sVar2 = std::
          vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
          ::size(&this->wasm->globals);
  if (uVar3 < sVar2) {
    this_02 = std::
              vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
              ::operator[](&this->wasm->globals,(ulong)local_1c);
    local_60 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::get(this_02);
    wasm::Name::operator=(&pGStack_18->name,(Name *)local_60);
    (pGStack_18->super_SpecificExpression<(wasm::Expression::Id)10>).super_Expression.type.id =
         (local_60->type).id;
    this_03 = std::
              map<unsigned_int,_std::vector<wasm::Name_*,_std::allocator<wasm::Name_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<wasm::Name_*,_std::allocator<wasm::Name_*>_>_>_>_>
              ::operator[](&this->globalRefs,&local_1c);
    local_68 = &pGStack_18->name;
    std::vector<wasm::Name_*,_std::allocator<wasm::Name_*>_>::push_back(this_03,&local_68);
    return;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"invalid global index",&local_41);
  throwError(this,&local_40);
}

Assistant:

void WasmBinaryBuilder::visitGlobalGet(GlobalGet* curr) {
  BYN_TRACE("zz node: GlobalGet " << pos << std::endl);
  auto index = getU32LEB();
  if (index >= wasm.globals.size()) {
    throwError("invalid global index");
  }
  auto* global = wasm.globals[index].get();
  curr->name = global->name;
  curr->type = global->type;
  globalRefs[index].push_back(&curr->name); // we don't know the final name yet
}